

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickle_step.c
# Opt level: O1

void delete_pickle_step_content(PickleStep *pickle_step)

{
  PickleString *pickle_string;
  
  if (pickle_step->ast_node_ids != (PickleAstNodeIds *)0x0) {
    PickleAstNodeIds_delete(pickle_step->ast_node_ids);
  }
  if (pickle_step->id != (wchar_t *)0x0) {
    free(pickle_step->id);
  }
  if (pickle_step->text != (wchar_t *)0x0) {
    free(pickle_step->text);
  }
  pickle_string = (PickleString *)pickle_step->argument;
  if (pickle_string != (PickleString *)0x0) {
    if (pickle_string->type == Argument_Table) {
      PickleTable_delete((PickleTable *)pickle_string);
      return;
    }
    if (pickle_string->type == Argument_String) {
      PickleString_delete(pickle_string);
      return;
    }
  }
  return;
}

Assistant:

static void delete_pickle_step_content(const PickleStep* pickle_step) {
    if (pickle_step->ast_node_ids) {
        PickleAstNodeIds_delete(pickle_step->ast_node_ids);
    }
    if (pickle_step->id) {
        free((void*)pickle_step->id);
    }
    if (pickle_step->text) {
        free((void*)pickle_step->text);
    }
    if (pickle_step->argument) {
        if (pickle_step->argument->type == Argument_String) {
            PickleString_delete((const PickleString*)pickle_step->argument);
        }
        else if (pickle_step->argument->type == Argument_Table) {
            PickleTable_delete((const PickleTable*)pickle_step->argument);
        }
    }
}